

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O1

String * __thiscall
capnp::TextCodec::encode(String *__return_storage_ptr__,TextCodec *this,Reader *value)

{
  Reader value_00;
  Reader value_01;
  char *pcVar1;
  char *local_b8;
  size_t in_stack_ffffffffffffff50;
  ArrayDisposer *in_stack_ffffffffffffff58;
  Branch *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  ArrayDisposer *in_stack_ffffffffffffff70;
  Schema in_stack_ffffffffffffff78;
  SegmentReader *in_stack_ffffffffffffff80;
  CapTableReader *in_stack_ffffffffffffff88;
  void *pvStack_70;
  WirePointer *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  ReaderFor<DynamicList> local_50;
  
  if (this->prettyPrint != false) {
    if (value->type == LIST) {
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_50,value);
      value_01.schema.elementType.field_4.schema = (RawBrandedSchema *)in_stack_ffffffffffffff58;
      value_01.schema.elementType.baseType = (short)in_stack_ffffffffffffff50;
      value_01.schema.elementType.listDepth = (char)(in_stack_ffffffffffffff50 >> 0x10);
      value_01.schema.elementType.isImplicitParam = (bool)(char)(in_stack_ffffffffffffff50 >> 0x18);
      value_01.schema.elementType.field_3 =
           (anon_union_2_2_d12d5221_for_Type_3)(short)(in_stack_ffffffffffffff50 >> 0x20);
      value_01.schema.elementType._6_2_ = (short)(in_stack_ffffffffffffff50 >> 0x30);
      value_01.reader.segment = (SegmentReader *)in_stack_ffffffffffffff60;
      value_01.reader.capTable = (CapTableReader *)in_stack_ffffffffffffff68;
      value_01.reader.ptr = (byte *)in_stack_ffffffffffffff70;
      value_01.reader._24_8_ = in_stack_ffffffffffffff78.raw;
      value_01.reader._32_8_ = in_stack_ffffffffffffff80;
      value_01.reader._40_8_ = in_stack_ffffffffffffff88;
      prettyPrint(value_01);
      kj::StringTree::flatten(__return_storage_ptr__,(StringTree *)&stack0xffffffffffffff40);
      if (in_stack_ffffffffffffff60 != (Branch *)0x0) {
        (**in_stack_ffffffffffffff70->_vptr_ArrayDisposer)
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60,0x40,
                   in_stack_ffffffffffffff68,in_stack_ffffffffffffff68,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct,
                   local_50.schema.elementType._0_8_,local_50.schema.elementType.field_4.schema,
                   local_50.reader.segment,local_50.reader.capTable,local_50.reader.ptr,
                   local_50.reader._24_8_,local_50.reader._32_8_,local_50.reader._40_8_);
      }
      pcVar1 = local_b8;
      if (local_b8 == (char *)0x0) {
        return __return_storage_ptr__;
      }
      local_b8 = (char *)0x0;
      (**in_stack_ffffffffffffff58->_vptr_ArrayDisposer)
                (in_stack_ffffffffffffff58,pcVar1,1,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff50,0);
      return __return_storage_ptr__;
    }
    if (value->type == STRUCT) {
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&stack0xffffffffffffff78,value);
      value_00.reader.segment = (SegmentReader *)in_stack_ffffffffffffff58;
      value_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_ffffffffffffff50;
      value_00.reader.capTable = (CapTableReader *)in_stack_ffffffffffffff60;
      value_00.reader.data = (void *)in_stack_ffffffffffffff68;
      value_00.reader.pointers = (WirePointer *)in_stack_ffffffffffffff70;
      value_00.reader._32_8_ = in_stack_ffffffffffffff78.raw;
      value_00.reader._40_8_ = in_stack_ffffffffffffff80;
      prettyPrint(value_00);
      kj::StringTree::flatten(__return_storage_ptr__,(StringTree *)&stack0xffffffffffffff40);
      if (in_stack_ffffffffffffff60 != (Branch *)0x0) {
        (**in_stack_ffffffffffffff70->_vptr_ArrayDisposer)
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60,0x40,
                   in_stack_ffffffffffffff68,in_stack_ffffffffffffff68,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct,
                   in_stack_ffffffffffffff78.raw,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88
                   ,pvStack_70,local_68,uStack_60,local_58);
      }
      pcVar1 = local_b8;
      if (local_b8 == (char *)0x0) {
        return __return_storage_ptr__;
      }
      local_b8 = (char *)0x0;
      (**in_stack_ffffffffffffff58->_vptr_ArrayDisposer)
                (in_stack_ffffffffffffff58,pcVar1,1,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff50,0);
      return __return_storage_ptr__;
    }
  }
  kj::str<capnp::DynamicValue::Reader&>(__return_storage_ptr__,(kj *)value,value);
  return __return_storage_ptr__;
}

Assistant:

kj::String TextCodec::encode(DynamicValue::Reader value) const {
  if (!prettyPrint) {
    return kj::str(value);
  } else {
    if (value.getType() == DynamicValue::Type::STRUCT) {
      return capnp::prettyPrint(value.as<DynamicStruct>()).flatten();
    } else if (value.getType() == DynamicValue::Type::LIST) {
      return capnp::prettyPrint(value.as<DynamicList>()).flatten();
    } else {
      return kj::str(value);
    }
  }
}